

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

long * __thiscall
itlib::small_vector<long,_4UL,_0UL,_std::allocator<long>_>::choose_data
          (small_vector<long,_4UL,_0UL,_std::allocator<long>_> *this,size_t desired_capacity)

{
  pointer plVar1;
  ulong in_RSI;
  small_vector<long,_4UL,_0UL,_std::allocator<long>_> *in_RDI;
  pointer in_stack_ffffffffffffffd8;
  long *local_8;
  
  if (in_RDI->m_begin == in_RDI->m_dynamic_data) {
    if (in_RDI->m_dynamic_capacity < in_RSI) {
      while (in_RDI->m_dynamic_capacity < in_RSI) {
        in_RDI->m_dynamic_capacity = in_RDI->m_dynamic_capacity * 3;
        in_RDI->m_dynamic_capacity = in_RDI->m_dynamic_capacity + 1;
        in_RDI->m_dynamic_capacity = in_RDI->m_dynamic_capacity >> 1;
      }
      get_alloc(in_RDI);
      plVar1 = std::allocator_traits<std::allocator<long>_>::allocate
                         ((allocator_type *)in_RDI,(size_type)in_stack_ffffffffffffffd8);
      in_RDI->m_dynamic_data = plVar1;
      local_8 = in_RDI->m_dynamic_data;
    }
    else {
      local_8 = in_RDI->m_dynamic_data;
    }
  }
  else if (in_RSI < 5) {
    local_8 = static_begin_ptr(in_RDI);
  }
  else {
    if (in_RDI->m_dynamic_capacity < in_RSI) {
      if (in_RDI->m_dynamic_data != (pointer)0x0) {
        get_alloc(in_RDI);
        std::allocator_traits<std::allocator<long>_>::deallocate
                  ((allocator_type *)in_RDI,in_stack_ffffffffffffffd8,0x18d9f6);
      }
      in_RDI->m_dynamic_capacity = in_RSI;
      get_alloc(in_RDI);
      plVar1 = std::allocator_traits<std::allocator<long>_>::allocate
                         ((allocator_type *)in_RDI,(size_type)in_stack_ffffffffffffffd8);
      in_RDI->m_dynamic_data = plVar1;
    }
    local_8 = in_RDI->m_dynamic_data;
  }
  return local_8;
}

Assistant:

T* choose_data(size_t desired_capacity)
    {
        if (m_begin == m_dynamic_data)
        {
            // we're at the dyn buffer, so see if it needs resize or revert to static

            if (desired_capacity > m_dynamic_capacity)
            {
                while (m_dynamic_capacity < desired_capacity)
                {
                    // grow by roughly 1.5
                    m_dynamic_capacity *= 3;
                    ++m_dynamic_capacity;
                    m_dynamic_capacity /= 2;
                }

                m_dynamic_data = atraits::allocate(get_alloc(), m_dynamic_capacity);
                return m_dynamic_data;
            }
            else if (desired_capacity < RevertToStaticSize)
            {
                // we're reverting to the static buffer
                return static_begin_ptr();
            }
            else
            {
                // if the capacity and we don't revert to static, just do nothing
                return m_dynamic_data;
            }
        }
        else
        {
            assert(m_begin == static_begin_ptr()); // corrupt begin ptr?

            if (desired_capacity > StaticCapacity)
            {
                // we must move to dyn memory

                // see if we have enough
                if (desired_capacity > m_dynamic_capacity)
                {
                    // we need to allocate more
                    // we don't have anything to destroy, so we can also deallocate the buffer
                    if (m_dynamic_data)
                    {
                        atraits::deallocate(get_alloc(), m_dynamic_data, m_dynamic_capacity);
                    }

                    m_dynamic_capacity = desired_capacity;
                    m_dynamic_data = atraits::allocate(get_alloc(), m_dynamic_capacity);
                }

                return m_dynamic_data;
            }
            else
            {
                // we have enough capacity as it is
                return static_begin_ptr();
            }
        }
    }